

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.cpp
# Opt level: O3

void __thiscall List<Command_*>::RemoveAt(List<Command_*> *this,long index)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(this + 0x10);
  if (index < 0 || lVar1 <= index) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Throw RangeException\n",0x15);
    lVar1 = *(long *)(this + 0x10);
  }
  if (index < lVar1 + -1) {
    lVar2 = index + 1;
    do {
      *(undefined8 *)(*(long *)this + -8 + lVar2 * 8) = *(undefined8 *)(*(long *)this + lVar2 * 8);
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  *(long *)(this + 0x10) = lVar1 + -1;
  return;
}

Assistant:

void List<Item>::RemoveAt(long index) {
    if (index < 0 || index >= Count())
        std::cout << "Throw RangeException\n";
    for (long i = index; i < Count()-1; i++)
        _items[i] = _items[i+1];
    _count--;
}